

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::d2star(Forth *this)

{
  uint uVar1;
  uint uVar2;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,2,"D2*");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,1,uVar1 * 2);
  ForthStack<unsigned_int>::setTop
            (this_00,0,(uint)(((ulong)uVar2 << 0x21) + (ulong)uVar1 * 2 >> 0x20));
  return;
}

Assistant:

void d2star(){
			REQUIRE_DSTACK_DEPTH(2, "D2*");
			DCell d1(dStack.getTop(1), dStack.getTop());
			d1.data_.Dcells <<= 1;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}